

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O1

string * __thiscall
duckdb::KeyValueSecret::ToString_abi_cxx11_
          (string *__return_storage_ptr__,KeyValueSecret *this,SecretDisplayType mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pbVar5;
  pointer pcVar6;
  long *plVar7;
  const_iterator cVar8;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr p_Var10;
  size_type *psVar11;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *scope_it;
  pointer pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  KeyValueSecret *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined4 local_54;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_54 = (undefined4)CONCAT71(in_register_00000011,mode);
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_80 = this;
  ::std::operator+(&local_78,"name=",&(this->super_BaseSecret).name);
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_78);
  paVar3 = &local_a8.field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_a8.field_2._M_allocated_capacity = *psVar11;
    local_a8.field_2._8_8_ = plVar7[3];
    local_a8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar11;
    local_a8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_a8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  paVar4 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar4) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  ::std::operator+(&local_78,"type=",&(local_80->super_BaseSecret).type);
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_78);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_a8.field_2._M_allocated_capacity = *psVar11;
    local_a8.field_2._8_8_ = plVar7[3];
    local_a8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar11;
    local_a8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_a8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar4) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  ::std::operator+(&local_78,"provider=",&(local_80->super_BaseSecret).provider);
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_78);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_a8.field_2._M_allocated_capacity = *psVar11;
    local_a8.field_2._8_8_ = plVar7[3];
    local_a8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar11;
    local_a8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_a8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_88 = paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar4) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"serializable=","");
  plVar7 = (long *)::std::__cxx11::string::append((char *)local_50);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_78.field_2._M_allocated_capacity = *psVar11;
    local_78.field_2._8_8_ = plVar7[3];
    local_78._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar11;
    local_78._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_78._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_78);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_a8.field_2._M_allocated_capacity = *psVar11;
    local_a8.field_2._8_8_ = plVar7[3];
    local_a8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar11;
    local_a8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_a8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar4) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  pbVar5 = (local_80->super_BaseSecret).prefix_paths.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar12 = (local_80->super_BaseSecret).prefix_paths.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar5; pbVar12 = pbVar12 + 1
      ) {
    pcVar6 = (pbVar12->_M_dataplus)._M_p;
    local_a8._M_dataplus._M_p = (pointer)paVar3;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar6,pcVar6 + pbVar12->_M_string_length);
    ::std::__cxx11::string::append((char *)&local_a8);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  ::std::__cxx11::string::substr((ulong)&local_a8,(ulong)__return_storage_ptr__);
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  p_Var10 = (local_80->secret_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(local_80->secret_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var2) {
    local_80 = (KeyValueSecret *)&local_80->redact_keys;
    do {
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(p_Var10 + 1));
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (((char)local_54 == '\0') &&
         (cVar8 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_80,(key_type *)(p_Var10 + 1)),
         cVar8.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur != (__node_type *)0x0)) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        Value::ToString_abi_cxx11_(&local_a8,(Value *)(p_Var10 + 2));
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar3) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
      }
      p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(&p_Var2->_M_header);
      if (p_Var10 != p_Var9) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      p_Var10 = (_Base_ptr)::std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var2);
  }
  return __return_storage_ptr__;
}

Assistant:

string KeyValueSecret::ToString(SecretDisplayType mode) const {
	string result;

	result += "name=" + name + ";";
	result += "type=" + type + ";";
	result += "provider=" + provider + ";";
	result += string("serializable=") + (serializable ? "true" : "false") + ";";
	result += "scope=";
	for (const auto &scope_it : prefix_paths) {
		result += scope_it + ",";
	}
	result = result.substr(0, result.size() - 1);
	result += ";";
	for (auto it = secret_map.begin(); it != secret_map.end(); it++) {
		result.append(it->first);
		result.append("=");
		if (mode == SecretDisplayType::REDACTED && redact_keys.find(it->first) != redact_keys.end()) {
			result.append("redacted");
		} else {
			result.append(it->second.ToString());
		}
		if (it != --secret_map.end()) {
			result.append(";");
		}
	}

	return result;
}